

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_p.h
# Opt level: O2

void __thiscall QDnsLookupReply::makeInvalidReplyError(QDnsLookupReply *this,QString *msg)

{
  QDnsDomainNameRecord *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  QDnsLookupReply *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_130;
  QDnsLookupReply local_118;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((msg->d).size == 0) {
    this_00 = &local_118;
    QDnsLookup::tr((QString *)this_00,"Invalid reply received",(char *)0x0,-1);
    pDVar2 = (msg->d).d;
    pDVar3 = (Data *)(msg->d).ptr;
    (msg->d).d = (Data *)local_118._0_8_;
    (msg->d).ptr = (char16_t *)local_118.errorString.d.d;
    pQVar1 = (QDnsDomainNameRecord *)(msg->d).size;
    (msg->d).size = (qsizetype)local_118.errorString.d.ptr;
    local_118._0_8_ = pDVar2;
    local_118.errorString.d.d = (Data *)pDVar3;
    local_118.errorString.d.ptr = (char16_t *)pQVar1;
  }
  else {
    this_00 = (QDnsLookupReply *)&local_130;
    QDnsLookup::tr((QString *)this_00,"Invalid reply received (%1)",(char *)0x0,-1);
    QString::arg<QString,_true>((QString *)&local_118,(QString *)this_00,msg,0,(QChar)0x20);
    pDVar2 = (msg->d).d;
    pDVar3 = (Data *)(msg->d).ptr;
    (msg->d).d = (Data *)local_118._0_8_;
    (msg->d).ptr = (char16_t *)local_118.errorString.d.d;
    pQVar1 = (QDnsDomainNameRecord *)(msg->d).size;
    (msg->d).size = (qsizetype)local_118.errorString.d.ptr;
    local_118._0_8_ = pDVar2;
    local_118.errorString.d.d = (Data *)pDVar3;
    local_118.errorString.d.ptr = (char16_t *)pQVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_118);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
  memset(&local_118,0,0xf0);
  operator=(this,&local_118);
  ~QDnsLookupReply(&local_118);
  this->error = InvalidReplyError;
  QArrayDataPointer<char16_t>::swap(&(this->errorString).d,&msg->d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void makeInvalidReplyError(QString &&msg = QString())
    {
        if (msg.isEmpty())
            msg = QDnsLookup::tr("Invalid reply received");
        else
            msg = QDnsLookup::tr("Invalid reply received (%1)").arg(std::move(msg));
        *this = QDnsLookupReply();  // empty our lists
        setError(QDnsLookup::InvalidReplyError, std::move(msg));
    }